

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O3

void do_cmd_accept_character(command *cmd)

{
  uint32_t *puVar1;
  int16_t *piVar2;
  ushort uVar3;
  uint uVar4;
  player_race *ppVar5;
  equip_slot *peVar6;
  player_body *ppVar7;
  object *poVar8;
  object *poVar9;
  player_body *ppVar10;
  undefined6 uVar11;
  player_body *ppVar12;
  uint8_t uVar13;
  _Bool _Var14;
  int iVar15;
  uint32_t uVar16;
  wchar_t wVar17;
  char *pcVar19;
  level_conflict *plVar20;
  equip_slot *peVar21;
  obj_property *poVar22;
  object_kind *poVar23;
  uint *puVar24;
  object *poVar25;
  object *poVar26;
  town *ptVar27;
  ego_item *peVar28;
  player *ppVar29;
  byte bVar30;
  int iVar31;
  wchar_t wVar32;
  ulong uVar33;
  start_item *psVar34;
  long lVar35;
  char local_88 [88];
  int iVar18;
  
  options_init_cheat();
  pcVar19 = option_name(0x2a);
  option_set(pcVar19,0);
  iVar15 = (uint)player->hitdie * 0x32 + -0x32;
  iVar18 = iVar15 * 3 + 7;
  if (-1 < iVar15 * 3) {
    iVar18 = iVar15 * 3;
  }
  iVar31 = iVar15 * 5 + 7;
  if (-1 < iVar15 * 5) {
    iVar31 = iVar15 * 5;
  }
  lVar35 = 1;
  ppVar29 = player;
  do {
    do {
      uVar16 = Rand_div((uint)ppVar29->hitdie);
      ppVar29 = player;
      player->player_hp[lVar35] = (short)uVar16 + player->player_hp[lVar35 + -1] + 1;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 0x32);
    lVar35 = 1;
  } while (((int)ppVar29->player_hp[0x31] < (iVar18 >> 3) + 0x32) ||
          ((iVar31 >> 3) + 0x32 < (int)ppVar29->player_hp[0x31]));
  ignore_birth_init();
  ppVar29 = player;
  if ((player->opts).opt[0x2b] == true) {
    plVar20 = level_by_name(world,"Anfauglith 58");
    ppVar29 = player;
    player->place = (int16_t)plVar20->index;
    ppVar29->upkeep->create_stair = FEAT_MORE;
  }
  else {
    player->place = player->home;
  }
  history_clear(ppVar29);
  history_add(player,"Began the quest to destroy Morgoth.",L'\x01');
  message_add(" ",0);
  message_add("  ",0);
  message_add("====================",0);
  message_add("  ",0);
  message_add(" ",0);
  ppVar12 = bodies;
  ppVar29 = player;
  ppVar5 = player->race;
  if (ppVar5 == (player_race *)0x0) {
    __assert_fail("p->race",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-birth.c"
                  ,0x19e,"void player_embody(struct player *)");
  }
  ppVar7 = bodies[ppVar5->body].next;
  pcVar19 = bodies[ppVar5->body].name;
  ppVar10 = bodies + ppVar5->body;
  uVar11 = *(undefined6 *)&ppVar10->field_0x12;
  peVar21 = *(equip_slot **)(&ppVar10->count + 4);
  (ppVar29->body).count = ppVar10->count;
  *(undefined6 *)&(ppVar29->body).field_0x12 = uVar11;
  (ppVar29->body).slots = peVar21;
  (ppVar29->body).next = ppVar7;
  (ppVar29->body).name = pcVar19;
  my_strcpy(local_88,ppVar12[ppVar5->body].name,0x50);
  pcVar19 = string_make(local_88);
  (ppVar29->body).name = pcVar19;
  peVar21 = (equip_slot *)mem_zalloc((ulong)(ppVar29->body).count << 5);
  (ppVar29->body).slots = peVar21;
  if ((ppVar29->body).count != 0) {
    lVar35 = 0;
    uVar33 = 0;
    do {
      peVar6 = bodies[ppVar29->race->body].slots;
      *(undefined2 *)((long)&peVar21->type + lVar35) = *(undefined2 *)((long)&peVar6->type + lVar35)
      ;
      my_strcpy(local_88,*(char **)((long)&peVar6->name + lVar35),0x50);
      pcVar19 = string_make(local_88);
      peVar21 = (ppVar29->body).slots;
      *(char **)((long)&peVar21->name + lVar35) = pcVar19;
      uVar33 = uVar33 + 1;
      lVar35 = lVar35 + 0x20;
    } while (uVar33 < (ppVar29->body).count);
  }
  ppVar29 = player;
  uVar3 = z_info->start_gold;
  player->au_birth = (uint)uVar3;
  ppVar29->au = (uint)uVar3;
  player_spells_init(ppVar29);
  if ((player->opts).opt[0x28] == true) {
    player_learn_all_runes(player);
  }
  poVar26 = player->obj_k;
  poVar26->ac = 1;
  poVar26->to_a = 1;
  poVar26->to_h = 1;
  poVar26->to_d = 1;
  poVar26->dd = '\x01';
  init_race_probs();
  store_reset();
  chunk_list_max = 0;
  player_learn_innate(player);
  seed_randart = Rand_div(0x10000000);
  initialize_random_artifacts(seed_randart);
  deactivate_randart_file();
  seed_flavor = Rand_div(0x10000000);
  flavor_init();
  if ((player->opts).opt[0x29] == true) {
    flavor_set_all_aware();
  }
  ppVar29 = player;
  player->upkeep->total_weight = L'\0';
  poVar26 = ppVar29->obj_k;
  poVar26->dd = '\x01';
  poVar26->ds = '\x01';
  poVar26->ac = 1;
  wVar32 = L'\x01';
  do {
    poVar22 = lookup_obj_property(L'\x03',wVar32);
    wVar17 = poVar22->subtype;
    if (wVar17 == L'\x04') {
      flag_on_dbg(ppVar29->obj_k->flags,6,wVar32,"p->obj_k->flags","i");
      wVar17 = poVar22->subtype;
    }
    if (wVar17 == L'\a') {
      flag_on_dbg(ppVar29->obj_k->flags,6,wVar32,"p->obj_k->flags","i");
      wVar17 = poVar22->subtype;
    }
    if (wVar17 == L'\b') {
      flag_on_dbg(ppVar29->obj_k->flags,6,wVar32,"p->obj_k->flags","i");
      wVar17 = poVar22->subtype;
    }
    if (wVar17 == L'\t') {
      flag_on_dbg(ppVar29->obj_k->flags,6,wVar32,"p->obj_k->flags","i");
    }
    wVar32 = wVar32 + L'\x01';
  } while (wVar32 != L'-');
  psVar34 = ppVar29->class->start_items;
  do {
    if (psVar34 == (start_item *)0x0) {
      if ((ppVar29->opts).opt[0x2b] == true) {
        poVar25 = object_new();
        wVar32 = lookup_sval(L'\x14',"Amethyst");
        poVar23 = lookup_kind(L'\x14',wVar32);
        object_prep(poVar25,poVar23,L'\0',MINIMISE);
        poVar25->modifiers[0x10] = 4;
        flag_on_dbg(poVar25->flags,6,0xd,"obj->flags","OF_TELEPATHY");
        poVar25->origin = '\x12';
        poVar26 = object_new();
        poVar25->known = poVar26;
        object_set_base_known(ppVar29,poVar25);
        object_flavor_aware(ppVar29,poVar25);
        poVar26 = poVar25->known;
        poVar26->pval = poVar25->pval;
        poVar26->effect = poVar25->effect;
        poVar26->notice = poVar26->notice | 2;
        inven_carry(ppVar29,poVar25,true,false);
        poVar23->everseen = true;
        poVar25 = object_new();
        wVar32 = lookup_sval(L'\x18',"Detection");
        poVar23 = lookup_kind(L'\x18',wVar32);
        object_prep(poVar25,poVar23,L'\0',MINIMISE);
        poVar25->origin = '\x12';
        poVar26 = object_new();
        poVar25->known = poVar26;
        object_set_base_known(ppVar29,poVar25);
        object_flavor_aware(ppVar29,poVar25);
        poVar26 = poVar25->known;
        poVar26->pval = poVar25->pval;
        poVar26->effect = poVar25->effect;
        poVar26->notice = poVar26->notice | 2;
        inven_carry(ppVar29,poVar25,true,false);
        poVar23->everseen = true;
        poVar25 = object_new();
        wVar32 = lookup_sval(L'\x18',"Magic Mapping");
        poVar23 = lookup_kind(L'\x18',wVar32);
        object_prep(poVar25,poVar23,L'\0',MINIMISE);
        poVar25->origin = '\x12';
        poVar26 = object_new();
        poVar25->known = poVar26;
        object_set_base_known(ppVar29,poVar25);
        object_flavor_aware(ppVar29,poVar25);
        poVar26 = poVar25->known;
        poVar26->pval = poVar25->pval;
        poVar26->effect = poVar25->effect;
        poVar26->notice = poVar26->notice | 2;
        inven_carry(ppVar29,poVar25,true,false);
        poVar23->everseen = true;
        poVar25 = object_new();
        wVar32 = lookup_sval(L'\x19',"*Destruction*");
        poVar23 = lookup_kind(L'\x19',wVar32);
        object_prep(poVar25,poVar23,L'\0',MINIMISE);
        poVar25->number = '\x05';
        poVar25->origin = '\x12';
        poVar26 = object_new();
        poVar25->known = poVar26;
        object_set_base_known(ppVar29,poVar25);
        object_flavor_aware(ppVar29,poVar25);
        poVar26 = poVar25->known;
        poVar26->pval = poVar25->pval;
        poVar26->effect = poVar25->effect;
        poVar26->notice = poVar26->notice | 2;
        inven_carry(ppVar29,poVar25,true,false);
        poVar23->everseen = true;
        poVar25 = object_new();
        wVar32 = lookup_sval(L'\x19',"Identify Rune");
        poVar23 = lookup_kind(L'\x19',wVar32);
        object_prep(poVar25,poVar23,L'\0',MINIMISE);
        poVar25->number = '\x0f';
        poVar25->origin = '\x12';
        poVar26 = object_new();
        poVar25->known = poVar26;
        object_set_base_known(ppVar29,poVar25);
        object_flavor_aware(ppVar29,poVar25);
        poVar26 = poVar25->known;
        poVar26->pval = poVar25->pval;
        poVar26->effect = poVar25->effect;
        poVar26->notice = poVar26->notice | 2;
        inven_carry(ppVar29,poVar25,true,false);
        poVar23->everseen = true;
      }
      if (ppVar29->au < 0) {
        ppVar29->au = 0;
      }
      wield_all(ppVar29);
      wVar32 = slot_by_name(player,"weapon");
      poVar26 = slot_object(player,wVar32);
      ptVar27 = town_by_name(world,ppVar29->race->hometown);
      if ((((poVar26 != (object *)0x0) && (player->home != 0)) && (ptVar27 != (town *)0x0)) &&
         ((ptVar27->ego != (char *)0x0 &&
          (peVar28 = lookup_ego_item(ptVar27->ego,(uint)poVar26->tval,(uint)poVar26->sval),
          peVar28 != (ego_item *)0x0)))) {
        poVar25 = poVar26->known;
        poVar8 = poVar26->prev;
        poVar9 = poVar26->next;
        object_prep(poVar26,poVar26->kind,(int)ppVar29->depth,MINIMISE);
        poVar26->ego = peVar28;
        poVar26->prev = poVar8;
        poVar26->next = poVar9;
        poVar26->known = poVar25;
        ego_apply_magic(poVar26,(int)ppVar29->depth,MINIMISE);
        player_know_object(ppVar29,poVar26);
        while (_Var14 = object_fully_known(poVar26), !_Var14) {
          object_learn_unknown_rune(ppVar29,poVar26,false);
        }
      }
      update_player_object_knowledge(ppVar29);
      ppVar29 = player;
      puVar1 = &player->upkeep->update;
      *puVar1 = *puVar1 | 5;
      update_stuff(ppVar29);
      ppVar29 = player;
      piVar2 = &player->msp;
      player->chp = player->mhp;
      ppVar29->csp = *piVar2;
      ppVar29->is_dead = false;
      character_generated = true;
      ppVar29->upkeep->playing = true;
      cmd_disable_repeat();
      string_free(prev.history);
      prev.history = (char *)0x0;
      string_free(quickstart_prev.history);
      quickstart_prev.history = (char *)0x0;
      event_signal(EVENT_LEAVE_BIRTH);
      return;
    }
    iVar18 = rand_range(psVar34->min,psVar34->max);
    uVar13 = (uint8_t)iVar18;
    poVar23 = lookup_kind(psVar34->tval,psVar34->sval);
    if (poVar23 == (object_kind *)0x0) {
      __assert_fail("kind",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-birth.c"
                    ,0x2ad,"void player_outfit(struct player *)");
    }
    if (((ppVar29->opts).opt[0x26] == false) && ((ppVar29->opts).opt[0x2b] == false)) {
      _Var14 = tval_is_food_k(poVar23);
      uVar13 = '\x01';
      if ((_Var14) || (_Var14 = tval_is_light_k(poVar23), _Var14)) goto LAB_001b5057;
    }
    else {
LAB_001b5057:
      puVar24 = (uint *)psVar34->eopts;
      if ((puVar24 != (uint *)0x0) && (uVar4 = *puVar24, uVar4 != 0)) {
        do {
          puVar24 = puVar24 + 1;
          if ((int)uVar4 < 1) {
            bVar30 = (ppVar29->opts).opt[-uVar4];
          }
          else {
            bVar30 = (ppVar29->opts).opt[uVar4] ^ 1;
          }
          uVar4 = *puVar24;
        } while ((uVar4 != 0) && (bVar30 != 0));
        if (bVar30 == 0) goto LAB_001b5130;
      }
      poVar25 = object_new();
      object_prep(poVar25,poVar23,L'\0',MINIMISE);
      poVar25->number = uVar13;
      poVar25->origin = '\x12';
      poVar26 = object_new();
      poVar25->known = poVar26;
      object_set_base_known(ppVar29,poVar25);
      object_flavor_aware(ppVar29,poVar25);
      poVar26 = poVar25->known;
      poVar26->pval = poVar25->pval;
      poVar26->effect = poVar25->effect;
      poVar26->notice = poVar26->notice | 2;
      wVar32 = object_value_real(poVar25,(uint)poVar25->number);
      ppVar29->au = ppVar29->au - wVar32;
      inven_carry(ppVar29,poVar25,true,false);
      poVar23->everseen = true;
    }
LAB_001b5130:
    psVar34 = psVar34->next;
  } while( true );
}

Assistant:

void do_cmd_accept_character(struct command *cmd)
{
	options_init_cheat();

	/* Turn off persistent levels, for now */
	option_set(option_name(OPT_birth_levels_persist), 0);

	roll_hp();

	ignore_birth_init();

	/* Handle player placement */
	if (OPT(player, birth_thrall)) {
		player->place = level_by_name(world, "Anfauglith 58")->index;
		player->upkeep->create_stair = FEAT_MORE;
	} else {
		player->place = player->home;
	}

	/* Clear old messages, add new starting message */
	history_clear(player);
	history_add(player, "Began the quest to destroy Morgoth.", HIST_PLAYER_BIRTH);

	/* Note player birth in the message recall */
	message_add(" ", MSG_GENERIC);
	message_add("  ", MSG_GENERIC);
	message_add("====================", MSG_GENERIC);
	message_add("  ", MSG_GENERIC);
	message_add(" ", MSG_GENERIC);

	/* Embody */
	player_embody(player);

	/* Give the player some money */
	get_money(player);

	/* Initialise the spells */
	player_spells_init(player);

	/* Know all runes for ID on walkover */
	if (OPT(player, birth_know_runes))
		player_learn_all_runes(player);

	/* Hack - player knows all combat runes.  Maybe make them not runes? NRM */
	player->obj_k->to_a = 1;
	player->obj_k->to_h = 1;
	player->obj_k->to_d = 1;
	player->obj_k->ac = 1;
	player->obj_k->dd = 1;

	/* Initialise the stores, dungeon */
	init_race_probs();
	store_reset();
	chunk_list_max = 0;

	/* Player learns innate runes */
	player_learn_innate(player);

	/* Generate random artifacts */
	seed_randart = randint0(0x10000000);
	initialize_random_artifacts(seed_randart);
	deactivate_randart_file();

	/* Seed for flavors */
	seed_flavor = randint0(0x10000000);
	flavor_init();

	/* Know all flavors for auto-ID of consumables */
	if (OPT(player, birth_know_flavors))
		flavor_set_all_aware();

	/* Outfit the player, if they can sell the stuff */
	player_outfit(player);

	/* Max HP and SP */
	get_bonuses();

	/* Stop the player being quite so dead */
	player->is_dead = false;

	/* Character is now "complete" */
	character_generated = true;
	player->upkeep->playing = true;

	/* Disable repeat command, so we don't try to be born again */
	cmd_disable_repeat();

	/* No longer need the cached history. */
	string_free(prev.history);
	prev.history = NULL;
	string_free(quickstart_prev.history);
	quickstart_prev.history = NULL;

	/* Now we're really done.. */
	event_signal(EVENT_LEAVE_BIRTH);
}